

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-ptr.t.cpp
# Opt level: O1

void __thiscall dynamicgraph::SignalPtr<double,int>::display(SignalPtr<double,int> *this)

{
  ostream *in_RSI;
  
  SignalPtr<double,_int>::display
            ((SignalPtr<double,_int> *)(this + *(long *)(*(long *)this + -0xb8)),in_RSI);
  return;
}

Assistant:

std::ostream &SignalPtr<T, Time>::display(std::ostream &os) const {
  dgTDEBUGIN(25) << SignalBase<Time>::name << this << "||" << isPlugged()
                 << "||" << signalPtr;
  { Signal<T, Time>::display(os); }

  if ((isAbstractPluged()) && (!autoref())) {
    os << " -->-- PLUGGED";
  } else {
    if (!isAbstractPluged())
      os << " UNPLUGGED";
    else if (autoref())
      os << " AUTOPLUGGED";
  }

  dgTDEBUGOUT(25);
  return os;
}